

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

shared_ptr<RandomForest::Node<double>_> __thiscall
RandomForest::Node<double>::GetRight(Node<double> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<RandomForest::Node<double>_> sVar1;
  Node<double> *this_local;
  
  std::shared_ptr<RandomForest::Node<double>_>::shared_ptr
            (&this->left,(shared_ptr<RandomForest::Node<double>_> *)(in_RSI + 0x10));
  sVar1.super___shared_ptr<RandomForest::Node<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<RandomForest::Node<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<RandomForest::Node<double>_>)
         sVar1.super___shared_ptr<RandomForest::Node<double>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<RandomForest::Node<T> > RandomForest::Node<T>::GetRight() const
{
    return right;
}